

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcShapeRepresentation,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcShapeRepresentation *in;
  
  in = (IfcShapeRepresentation *)operator_new(0xb8);
  *(undefined ***)&(in->super_IfcShapeModel).field_0xa0 = &PTR__Object_008a0070;
  *(undefined8 *)&in->field_0xa8 = 0;
  *(char **)&in->field_0xb0 = "IfcShapeRepresentation";
  Assimp::IFC::Schema_2x3::IfcShapeModel::IfcShapeModel
            ((IfcShapeModel *)in,&PTR_construction_vtable_24__00958cb8);
  (in->super_IfcShapeModel).super_IfcRepresentation.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcShapeRepresentation_00958c28;
  *(undefined ***)&(in->super_IfcShapeModel).field_0xa0 = &PTR__IfcShapeRepresentation_00958ca0;
  *(undefined ***)&(in->super_IfcShapeModel).super_IfcRepresentation.field_0x80 =
       &PTR__IfcShapeRepresentation_00958c50;
  *(undefined ***)&(in->super_IfcShapeModel).super_IfcRepresentation.field_0x90 =
       &PTR__IfcShapeRepresentation_00958c78;
  GenericFill<Assimp::IFC::Schema_2x3::IfcShapeRepresentation>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcShapeModel).super_IfcRepresentation.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcShapeModel).super_IfcRepresentation.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }